

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

CURLcode inflate_stream(connectdata *conn,contenc_writer *writer,zlibInitState started)

{
  void **zp;
  z_stream *z;
  int iVar1;
  content_encoding *pcVar2;
  uint uVar3;
  CURLcode CVar4;
  int iVar5;
  content_encoding *pcVar6;
  
  zp = &writer->params;
  z = (z_stream *)(writer + 1);
  if ((*(uint *)&writer->params < 7) && ((0x66U >> (*(uint *)&writer->params & 0x1f) & 1) != 0)) {
    iVar1 = *(int *)&writer[1].downstream;
    pcVar2 = writer[1].handler;
    pcVar6 = (content_encoding *)(*Curl_cmalloc)(0x4000);
    if (pcVar6 != (content_encoding *)0x0) {
switchD_0012c07e_caseD_0:
      writer[2].handler = pcVar6;
      *(undefined4 *)&writer[2].downstream = 0x4000;
      uVar3 = inflate(z,5);
      iVar5 = *(int *)&writer[2].downstream;
      if (uVar3 < 2 && iVar5 != 0x4000) {
        *(zlibInitState *)&writer->params = started;
        CVar4 = (*writer->downstream->handler->unencode_write)
                          (conn,writer->downstream,(char *)pcVar6,(long)iVar5 * 0xffffffff + 0x4000)
        ;
        if (CVar4 != CURLE_OK) {
          exit_zlib(conn,z,(zlibInitState *)zp,CVar4);
          goto LAB_0012c16e;
        }
      }
      switch(uVar3) {
      case 0:
        goto switchD_0012c07e_caseD_0;
      case 1:
        CVar4 = process_trailer(conn,(zlib_params *)zp);
        goto LAB_0012c16e;
      case 0xfffffffb:
        CVar4 = CURLE_OK;
LAB_0012c16e:
        (*Curl_cfree)(pcVar6);
        if ((iVar1 != 0) && (*(int *)zp == 1)) {
          *(zlibInitState *)zp = started;
        }
        return CVar4;
      case 0xfffffffd:
        if (*(int *)zp == 1) {
          inflateEnd(z);
          iVar5 = inflateInit2_(z,0xfffffff1,"1.2.11",0x70);
          if (iVar5 == 0) {
            writer[1].handler = pcVar2;
            *(int *)&writer[1].downstream = iVar1;
            *(undefined4 *)&writer->params = 2;
            goto switchD_0012c07e_caseD_0;
          }
          *(undefined4 *)zp = 0;
        }
      default:
        process_zlib_error((connectdata *)conn->data,(z_stream *)writer[3].handler);
        CVar4 = exit_zlib(conn,z,(zlibInitState *)zp,CURLE_BAD_CONTENT_ENCODING);
        goto LAB_0012c16e;
      }
    }
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CVar4 = CURLE_WRITE_ERROR;
  }
  CVar4 = exit_zlib(conn,z,(zlibInitState *)zp,CVar4);
  return CVar4;
}

Assistant:

static CURLcode inflate_stream(struct connectdata *conn,
                               contenc_writer *writer, zlibInitState started)
{
  zlib_params *zp = (zlib_params *) &writer->params;
  z_stream *z = &zp->z;         /* zlib state structure */
  uInt nread = z->avail_in;
  Bytef *orig_in = z->next_in;
  int status;                   /* zlib status */
  bool done = FALSE;
  CURLcode result = CURLE_OK;   /* Curl_client_write status */
  char *decomp;                 /* Put the decompressed data here. */

  /* Check state. */
  if(zp->zlib_init != ZLIB_INIT &&
     zp->zlib_init != ZLIB_INFLATING &&
     zp->zlib_init != ZLIB_INIT_GZIP &&
     zp->zlib_init != ZLIB_GZIP_INFLATING)
    return exit_zlib(conn, z, &zp->zlib_init, CURLE_WRITE_ERROR);

  /* Dynamically allocate a buffer for decompression because it's uncommonly
     large to hold on the stack */
  decomp = malloc(DSIZ);
  if(decomp == NULL)
    return exit_zlib(conn, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);

  /* because the buffer size is fixed, iteratively decompress and transfer to
     the client via downstream_write function. */
  while(!done) {
    done = TRUE;

    /* (re)set buffer for decompressed output for every iteration */
    z->next_out = (Bytef *) decomp;
    z->avail_out = DSIZ;

    status = inflate(z, Z_BLOCK);

    /* Flush output data if some. */
    if(z->avail_out != DSIZ) {
      if(status == Z_OK || status == Z_STREAM_END) {
        zp->zlib_init = started;      /* Data started. */
        result = Curl_unencode_write(conn, writer->downstream, decomp,
                                     DSIZ - z->avail_out);
        if(result) {
          exit_zlib(conn, z, &zp->zlib_init, result);
          break;
        }
      }
    }

    /* Dispatch by inflate() status. */
    switch(status) {
    case Z_OK:
      /* Always loop: there may be unflushed latched data in zlib state. */
      done = FALSE;
      break;
    case Z_BUF_ERROR:
      /* No more data to flush: just exit loop. */
      break;
    case Z_STREAM_END:
      result = process_trailer(conn, zp);
      break;
    case Z_DATA_ERROR:
      /* some servers seem to not generate zlib headers, so this is an attempt
         to fix and continue anyway */
      if(zp->zlib_init == ZLIB_INIT) {
        /* Do not use inflateReset2(): only available since zlib 1.2.3.4. */
        (void) inflateEnd(z);     /* don't care about the return code */
        if(inflateInit2(z, -MAX_WBITS) == Z_OK) {
          z->next_in = orig_in;
          z->avail_in = nread;
          zp->zlib_init = ZLIB_INFLATING;
          done = FALSE;
          break;
        }
        zp->zlib_init = ZLIB_UNINIT;    /* inflateEnd() already called. */
      }
      /* FALLTHROUGH */
    default:
      result = exit_zlib(conn, z, &zp->zlib_init, process_zlib_error(conn, z));
      break;
    }
  }
  free(decomp);

  /* We're about to leave this call so the `nread' data bytes won't be seen
     again. If we are in a state that would wrongly allow restart in raw mode
     at the next call, assume output has already started. */
  if(nread && zp->zlib_init == ZLIB_INIT)
    zp->zlib_init = started;      /* Cannot restart anymore. */

  return result;
}